

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::BuildImplicitArgIns(IRBuilder *this)

{
  ArgSlot AVar1;
  RegSlot RVar2;
  JITTimeFunctionBody *pJVar3;
  ushort local_16;
  ArgSlot i;
  RegSlot startReg;
  IRBuilder *this_local;
  
  pJVar3 = Func::GetJITFunctionBody(this->m_func);
  RVar2 = JITTimeFunctionBody::GetConstCount(pJVar3);
  local_16 = 1;
  while( true ) {
    pJVar3 = Func::GetJITFunctionBody(this->m_func);
    AVar1 = JITTimeFunctionBody::GetInParamsCount(pJVar3);
    if (AVar1 <= local_16) break;
    BuildArgIn(this,0xffffffff,(RVar2 - 1) + (uint)local_16,local_16);
    local_16 = local_16 + 1;
  }
  return;
}

Assistant:

void
IRBuilder::BuildImplicitArgIns()
{
    Js::RegSlot startReg = m_func->GetJITFunctionBody()->GetConstCount() - 1;
    for (Js::ArgSlot i = 1; i < m_func->GetJITFunctionBody()->GetInParamsCount(); i++)
    {
        this->BuildArgIn((uint32)-1, startReg + i, i);
    }
}